

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O0

wire_node_t * __thiscall
anon_unknown.dwarf_18860d::LogisimParser::point_on_wire(LogisimParser *this,Position position)

{
  bool bVar1;
  wire_container_t *this_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  unsigned_long *local_58;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_50;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  res;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *node;
  iterator __end1;
  iterator __begin1;
  wire_container_t *__range1;
  LogisimParser *this_local;
  Position position_local;
  
  this_00 = &(this->m_context).m_wires;
  this_local = (LogisimParser *)position;
  __end1 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::begin(this_00);
  node = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         std::
         vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                *)&node);
    if (!bVar1) {
      return (wire_node_t *)0x0;
    }
    res._M_current =
         (unsigned_long *)
         __gnu_cxx::
         __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
         ::operator*(&__end1);
    local_50._M_current =
         (unsigned_long *)
         std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)res._M_current);
    local_58 = (unsigned_long *)
               std::end<std::vector<unsigned_long,std::allocator<unsigned_long>>>(res._M_current);
    local_48 = std::
               find<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                         (local_50,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    )local_58,(unsigned_long *)&this_local);
    local_60._M_current =
         (unsigned_long *)
         std::end<std::vector<unsigned_long,std::allocator<unsigned_long>>>(res._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_60);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::operator++(&__end1);
  }
  return (wire_node_t *)res._M_current;
}

Assistant:

LogisimParser::wire_node_t *LogisimParser::point_on_wire(Position position) {

    for (auto &node : m_context.m_wires) {
        auto res = std::find(std::begin(node), std::end(node), position.m_full);
        if (res != std::end(node)) {
            return &node;
        }
    }

    return nullptr;
}